

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

int __thiscall Instructions::jumpInstruction(Instructions *this,string *name,int sign,int offset)

{
  byte bVar1;
  ushort uVar2;
  pointer pbVar3;
  ostream *poVar4;
  long *plVar5;
  
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  pbVar3 = (this->names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar1 = (this->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[(long)offset + 1];
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,pbVar3[bVar1]._M_dataplus._M_p,
                      pbVar3[bVar1]._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  uVar2 = *(ushort *)
           ((this->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + (long)offset + 2);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,offset);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
  plVar5 = (long *)std::ostream::operator<<
                             (poVar4,(uint)(ushort)(uVar2 << 8 | uVar2 >> 8) * sign + offset + 4);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  return offset + 4;
}

Assistant:

int Instructions::jumpInstruction(const std::string& name, int sign, int offset)
{
    std::cout << name << " ";
    auto tape = code[static_cast<int>(offset + 1)];
    std::cout << names[tape] << " ";
    uint16_t jump = (uint16_t)(code[static_cast<int>(offset + 2)] << 8);
    jump |= code[static_cast<int>(offset + 3)];
    std::cout << offset << " -> " << offset + 4 + sign * jump << std::endl;
    return offset + 4;
}